

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,initializer_list<std::complex<float>_> *list)

{
  size_type sVar1;
  ulong uVar2;
  iterator pcVar3;
  complex<float> *pcVar4;
  long lVar5;
  
  sVar1 = list->_M_len;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = sVar1;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 1;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018459c8;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01842418;
  (this->fWork).fStore = (complex<float> *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar2 = list->_M_len;
  if (uVar2 != 0) {
    pcVar4 = (complex<float> *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    memset(pcVar4,0,uVar2 * 8);
    this->fElem = pcVar4;
    pcVar3 = list->_M_array;
    pcVar4 = this->fElem;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&pcVar4->_M_value + lVar5) =
           *(undefined8 *)((long)&pcVar3->_M_value + lVar5);
      lVar5 = lVar5 + 8;
    } while (uVar2 << 3 != lVar5);
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<TVar>& list) 
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>(list.size(), 1)
{
	if (list.size() > 0) {
		this->fElem = new TVar[list.size()];
	}

	auto it = list.begin();
	auto it_end = list.end();
	TVar* aux = fElem;
	for (; it != it_end; it++, aux++)
		*aux = *it;
}